

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O2

uint lodepng_chunk_create(uchar **out,size_t *outsize,uint length,char *type,uchar *data)

{
  uint uVar1;
  ucvector v;
  ucvector local_30;
  
  local_30.data = *out;
  local_30.size = *outsize;
  local_30.allocsize = local_30.size;
  uVar1 = lodepng_chunk_createv(&local_30,length,type,data);
  *out = local_30.data;
  *outsize = local_30.size;
  return uVar1;
}

Assistant:

unsigned lodepng_chunk_create(unsigned char** out, size_t* outsize,
                              unsigned length, const char* type, const unsigned char* data) {
  ucvector v = ucvector_init(*out, *outsize);
  unsigned error = lodepng_chunk_createv(&v, length, type, data);
  *out = v.data;
  *outsize = v.size;
  return error;
}